

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall
QHttpNetworkReplyPrivate::readStatus(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  QByteArray *this_00;
  bool bVar1;
  long lVar2;
  qsizetype qVar3;
  qint64 qVar4;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView status;
  char c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->fragment;
  if ((this->fragment).d.size == 0) {
    QByteArray::reserve(this_00,0x20);
  }
  c = -0x56;
  qVar4 = 0;
  do {
    lVar2 = QIODevice::read((char *)socket,(longlong)&c);
    if (lVar2 == -1) {
      qVar4 = -1;
      break;
    }
    if (lVar2 == 0) break;
    if ((((lVar2 != 1) || ((this->fragment).d.size != 0)) || (0x20 < (ulong)(byte)c)) ||
       ((0x180002c00U >> ((ulong)(byte)c & 0x3f) & 1) == 0)) {
      qVar4 = qVar4 + 1;
      if (c == '\n') {
        lVar2 = (this->fragment).d.size;
        if (lVar2 == 0) {
          lVar2 = 0;
        }
        else if ((this->fragment).d.ptr[lVar2 + -1] == '\r') {
          QByteArray::truncate((longlong)this_00);
          lVar2 = (this->fragment).d.size;
        }
        status.m_data = (this->fragment).d.ptr;
        status.m_size = lVar2;
        bVar1 = QHttpHeaderParser::parseStatus
                          (&(this->super_QHttpNetworkHeaderPrivate).parser,status);
        this->state = ReadingHeaderState;
        QByteArray::clear();
        if (!bVar1) {
          qVar4 = -1;
        }
        break;
      }
      QByteArray::append((char)this_00);
      if ((this->fragment).d.size == 5) {
        qVar3 = QByteArrayView::lengthHelperCharArray("HTTP/",6);
        bv.m_data = "HTTP/";
        bv.m_size = qVar3;
        bVar1 = QByteArray::startsWith(this_00,bv);
        if (!bVar1) {
          QByteArray::clear();
          qVar4 = -1;
          break;
        }
      }
    }
  } while (lVar2 == 1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar4;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readStatus(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // reserve bytes for the status line. This is better than always append() which reallocs the byte array
        fragment.reserve(32);
    }

    qint64 bytes = 0;
    char c;
    qint64 haveRead = 0;

    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == -1)
            return -1; // unexpected EOF
        else if (haveRead == 0)
            break; // read more later
        else if (haveRead == 1 && fragment.size() == 0 && (c == 11 || c == '\n' || c == '\r' || c == ' ' || c == 31))
            continue; // Ignore all whitespace that was trailing froma previous request on that socket

        bytes++;

        // allow both CRLF & LF (only) line endings
        if (c == '\n') {
            // remove the CR at the end
            if (fragment.endsWith('\r')) {
                fragment.truncate(fragment.size()-1);
            }
            bool ok = parseStatus(fragment);
            state = ReadingHeaderState;
            fragment.clear();
            if (!ok) {
                return -1;
            }
            break;
        } else {
            fragment.append(c);
        }

        // is this a valid reply?
        if (fragment.size() == 5 && !fragment.startsWith("HTTP/")) {
            fragment.clear();
            return -1;
        }
    } while (haveRead == 1);

    return bytes;
}